

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

Convolution3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_convolution3d(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x5bf) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5bf;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x90);
    Convolution3DLayerParams::Convolution3DLayerParams(this_00.convolution3d_);
    (this->layer_).convolution3d_ = (Convolution3DLayerParams *)this_00;
  }
  return (Convolution3DLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::Convolution3DLayerParams* NeuralNetworkLayer::mutable_convolution3d() {
  if (!has_convolution3d()) {
    clear_layer();
    set_has_convolution3d();
    layer_.convolution3d_ = new ::CoreML::Specification::Convolution3DLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.convolution3d)
  return layer_.convolution3d_;
}